

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall spvtools::opt::analysis::Type::operator==(Type *this,Type *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  Type *other_local;
  Type *this_local;
  
  if (this->kind_ == other->kind_) {
    switch(this->kind_) {
    case kVoid:
      iVar1 = (*this->_vptr_Type[6])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var,iVar1),other);
      break;
    case kBool:
      iVar1 = (*this->_vptr_Type[8])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_00,iVar1),other);
      break;
    case kInteger:
      iVar1 = (*this->_vptr_Type[10])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_01,iVar1),other);
      break;
    case kFloat:
      iVar1 = (*this->_vptr_Type[0xc])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_02,iVar1),other);
      break;
    case kVector:
      iVar1 = (*this->_vptr_Type[0xe])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_03,iVar1),other);
      break;
    case kMatrix:
      iVar1 = (*this->_vptr_Type[0x10])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_04,iVar1),other);
      break;
    case kImage:
      iVar1 = (*this->_vptr_Type[0x12])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_05,iVar1),other);
      break;
    case kSampler:
      iVar1 = (*this->_vptr_Type[0x14])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_06,iVar1),other);
      break;
    case kSampledImage:
      iVar1 = (*this->_vptr_Type[0x16])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_07,iVar1),other);
      break;
    case kArray:
      iVar1 = (*this->_vptr_Type[0x18])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_08,iVar1),other);
      break;
    case kRuntimeArray:
      iVar1 = (*this->_vptr_Type[0x1a])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_09,iVar1),other);
      break;
    case kStruct:
      iVar1 = (*this->_vptr_Type[0x1c])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_10,iVar1),other);
      break;
    case kOpaque:
      iVar1 = (*this->_vptr_Type[0x1e])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_11,iVar1),other);
      break;
    case kPointer:
      iVar1 = (*this->_vptr_Type[0x20])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_12,iVar1),other);
      break;
    case kFunction:
      iVar1 = (*this->_vptr_Type[0x22])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_13,iVar1),other);
      break;
    case kEvent:
      iVar1 = (*this->_vptr_Type[0x24])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_14,iVar1),other);
      break;
    case kDeviceEvent:
      iVar1 = (*this->_vptr_Type[0x26])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_15,iVar1),other);
      break;
    case kReserveId:
      iVar1 = (*this->_vptr_Type[0x28])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_16,iVar1),other);
      break;
    case kQueue:
      iVar1 = (*this->_vptr_Type[0x2a])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_17,iVar1),other);
      break;
    case kPipe:
      iVar1 = (*this->_vptr_Type[0x2c])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_18,iVar1),other);
      break;
    case kForwardPointer:
      iVar1 = (*this->_vptr_Type[0x2e])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_19,iVar1),other);
      break;
    case kPipeStorage:
      iVar1 = (*this->_vptr_Type[0x30])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_20,iVar1),other);
      break;
    case kNamedBarrier:
      iVar1 = (*this->_vptr_Type[0x32])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_21,iVar1),other);
      break;
    case kAccelerationStructureNV:
      iVar1 = (*this->_vptr_Type[0x34])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_22,iVar1),other);
      break;
    case kCooperativeMatrixNV:
      iVar1 = (*this->_vptr_Type[0x36])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_23,iVar1),other);
      break;
    case kCooperativeMatrixKHR:
      iVar1 = (*this->_vptr_Type[0x38])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_24,iVar1),other);
      break;
    case kRayQueryKHR:
      iVar1 = (*this->_vptr_Type[0x3a])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_25,iVar1),other);
      break;
    case kHitObjectNV:
      iVar1 = (*this->_vptr_Type[0x3c])();
      this_local._7_1_ = IsSame((Type *)CONCAT44(extraout_var_26,iVar1),other);
      break;
    default:
      __assert_fail("false && \"Unhandled type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                    ,0xb8,"bool spvtools::opt::analysis::Type::operator==(const Type &) const");
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Type::operator==(const Type& other) const {
  if (kind_ != other.kind_) return false;

  switch (kind_) {
#define DeclareKindCase(kind) \
  case k##kind:               \
    return As##kind()->IsSame(&other)
    DeclareKindCase(Void);
    DeclareKindCase(Bool);
    DeclareKindCase(Integer);
    DeclareKindCase(Float);
    DeclareKindCase(Vector);
    DeclareKindCase(Matrix);
    DeclareKindCase(Image);
    DeclareKindCase(Sampler);
    DeclareKindCase(SampledImage);
    DeclareKindCase(Array);
    DeclareKindCase(RuntimeArray);
    DeclareKindCase(Struct);
    DeclareKindCase(Opaque);
    DeclareKindCase(Pointer);
    DeclareKindCase(Function);
    DeclareKindCase(Event);
    DeclareKindCase(DeviceEvent);
    DeclareKindCase(ReserveId);
    DeclareKindCase(Queue);
    DeclareKindCase(Pipe);
    DeclareKindCase(ForwardPointer);
    DeclareKindCase(PipeStorage);
    DeclareKindCase(NamedBarrier);
    DeclareKindCase(AccelerationStructureNV);
    DeclareKindCase(CooperativeMatrixNV);
    DeclareKindCase(CooperativeMatrixKHR);
    DeclareKindCase(RayQueryKHR);
    DeclareKindCase(HitObjectNV);
#undef DeclareKindCase
    default:
      assert(false && "Unhandled type");
      return false;
  }
}